

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

void tcu::fillWithGrid(PixelBufferAccess *access,int cellSize,Vec4 *colorA,Vec4 *colorB)

{
  ChannelOrder CVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec4 *pVVar7;
  Vec4 local_78;
  Vec4 local_68;
  PixelBufferAccess local_58;
  
  uVar3 = (ulong)(access->super_ConstPixelBufferAccess).m_format.type;
  if ((uVar3 < 0x26) && ((0x2007000000U >> (uVar3 & 0x3f) & 1) != 0)) {
    CVar1 = (access->super_ConstPixelBufferAccess).m_format.order;
    if ((CVar1 == DS) || (CVar1 == D)) {
      getEffectiveDepthStencilAccess(&local_58,access,MODE_DEPTH);
      fillWithGrid(&local_58,cellSize,colorA,colorB);
    }
    if (CVar1 - S < 2) {
      getEffectiveDepthStencilAccess(&local_58,access,MODE_STENCIL);
      local_68.m_data[0] = colorA->m_data[3];
      local_68.m_data[1] = colorA->m_data[2];
      local_68.m_data[3] = colorA->m_data[0];
      local_68.m_data[2] = colorA->m_data[1];
      local_78.m_data[0] = colorB->m_data[3];
      local_78.m_data[1] = colorB->m_data[2];
      local_78.m_data[3] = colorB->m_data[0];
      local_78.m_data[2] = colorB->m_data[1];
      fillWithGrid(&local_58,cellSize,&local_68,&local_78);
    }
  }
  else {
    iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
    if ((iVar4 == 1) && ((access->super_ConstPixelBufferAccess).m_size.m_data[2] == 1)) {
      if (0 < (access->super_ConstPixelBufferAccess).m_size.m_data[0]) {
        iVar4 = 0;
        do {
          pVVar7 = colorA;
          if (((long)iVar4 / (long)cellSize & 1U) != 0) {
            pVVar7 = colorB;
          }
          PixelBufferAccess::setPixel(access,pVVar7,iVar4,0,0);
          iVar4 = iVar4 + 1;
        } while (iVar4 < (access->super_ConstPixelBufferAccess).m_size.m_data[0]);
      }
    }
    else {
      iVar5 = (access->super_ConstPixelBufferAccess).m_size.m_data[2];
      if (iVar5 == 1) {
        if (0 < iVar4) {
          iVar4 = 0;
          do {
            if (0 < (access->super_ConstPixelBufferAccess).m_size.m_data[0]) {
              iVar5 = 0;
              do {
                iVar6 = (int)((long)iVar5 / (long)cellSize);
                pVVar7 = colorA;
                if (iVar6 - (((uint)((ulong)((long)iVar5 / (long)cellSize) >> 0x1f) & 1) + iVar6 &
                            0xfffffffe) != (iVar4 / cellSize) % 2) {
                  pVVar7 = colorB;
                }
                PixelBufferAccess::setPixel(access,pVVar7,iVar5,iVar4,0);
                iVar5 = iVar5 + 1;
              } while (iVar5 < (access->super_ConstPixelBufferAccess).m_size.m_data[0]);
            }
            iVar4 = iVar4 + 1;
          } while (iVar4 < (access->super_ConstPixelBufferAccess).m_size.m_data[1]);
        }
      }
      else if (0 < iVar5) {
        iVar4 = 0;
        do {
          if (0 < (access->super_ConstPixelBufferAccess).m_size.m_data[1]) {
            iVar5 = 0;
            do {
              if (0 < (access->super_ConstPixelBufferAccess).m_size.m_data[0]) {
                iVar6 = 0;
                do {
                  iVar2 = (int)((long)iVar6 / (long)cellSize);
                  pVVar7 = colorA;
                  if ((iVar2 - (((uint)((ulong)((long)iVar6 / (long)cellSize) >> 0x1f) & 1) + iVar2
                               & 0xfffffffe) ^ (iVar5 / cellSize) % 2) != (iVar4 / cellSize) % 2) {
                    pVVar7 = colorB;
                  }
                  PixelBufferAccess::setPixel(access,pVVar7,iVar6,iVar5,iVar4);
                  iVar6 = iVar6 + 1;
                } while (iVar6 < (access->super_ConstPixelBufferAccess).m_size.m_data[0]);
              }
              iVar5 = iVar5 + 1;
            } while (iVar5 < (access->super_ConstPixelBufferAccess).m_size.m_data[1]);
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < (access->super_ConstPixelBufferAccess).m_size.m_data[2]);
      }
    }
  }
  return;
}

Assistant:

void fillWithGrid (const PixelBufferAccess& access, int cellSize, const Vec4& colorA, const Vec4& colorB)
{
	if (isCombinedDepthStencilType(access.getFormat().type))
	{
		const bool hasDepth		= access.getFormat().order == tcu::TextureFormat::DS || access.getFormat().order == tcu::TextureFormat::D;
		const bool hasStencil	= access.getFormat().order == tcu::TextureFormat::DS || access.getFormat().order == tcu::TextureFormat::S;

		DE_ASSERT(hasDepth || hasStencil);

		// For combined formats, treat D and S as separate channels
		if (hasDepth)
			fillWithGrid(getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_DEPTH), cellSize, colorA, colorB);
		if (hasStencil)
			fillWithGrid(getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_STENCIL), cellSize, colorA.swizzle(3,2,1,0), colorB.swizzle(3,2,1,0));
	}
	else
	{
		if (access.getHeight() == 1 && access.getDepth() == 1)
			fillWithGrid1D(access, cellSize, colorA, colorB);
		else if (access.getDepth() == 1)
			fillWithGrid2D(access, cellSize, colorA, colorB);
		else
			fillWithGrid3D(access, cellSize, colorA, colorB);
	}
}